

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

u32 __thiscall
irr::scene::CSceneManager::registerNodeForRendering
          (CSceneManager *this,ISceneNode *node,E_SCENE_NODE_RENDER_PASS pass)

{
  u32 uVar1;
  int iVar2;
  uint uVar3;
  ISceneNode **ppIVar4;
  ulong uVar5;
  int in_EDX;
  ISceneNode *in_RSI;
  ISceneNode *in_RDI;
  bool bVar6;
  TransparentNodeEntry e;
  u32 i_1;
  u32 count;
  u32 i;
  u32 taken;
  ISceneNode *in_stack_ffffffffffffff48;
  ISceneNode *n;
  array<irr::scene::CSceneManager::DefaultNodeEntry> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  u32 uVar7;
  undefined4 in_stack_ffffffffffffff80;
  uint local_58;
  u32 local_1c;
  u32 local_18;
  
  local_18 = 0;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      local_18 = 1;
      local_1c = 0;
      while (uVar7 = local_1c,
            uVar1 = core::array<irr::scene::ISceneNode_*>::size
                              ((array<irr::scene::ISceneNode_*> *)0x2fadd5), uVar7 != uVar1) {
        ppIVar4 = core::array<irr::scene::ISceneNode_*>::operator[]
                            ((array<irr::scene::ISceneNode_*> *)in_stack_ffffffffffffff50,
                             (u32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (*ppIVar4 == in_RSI) {
          local_18 = 0;
          break;
        }
        local_1c = local_1c + 1;
      }
      if (local_18 != 0) {
        core::array<irr::scene::ISceneNode_*>::push_back
                  ((array<irr::scene::ISceneNode_*> *)in_stack_ffffffffffffff50,
                   (ISceneNode **)in_stack_ffffffffffffff48);
      }
    }
    else if (in_EDX != 2) {
      if (in_EDX == 4) {
        core::array<irr::scene::ISceneNode_*>::push_back
                  ((array<irr::scene::ISceneNode_*> *)in_stack_ffffffffffffff50,
                   (ISceneNode **)in_stack_ffffffffffffff48);
        local_18 = 1;
      }
      else if (in_EDX == 8) {
        uVar3 = (*in_RDI->_vptr_ISceneNode[0x23])(in_RDI,in_RSI);
        bVar6 = (uVar3 & 1) == 0;
        if (bVar6) {
          DefaultNodeEntry::DefaultNodeEntry
                    ((DefaultNodeEntry *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          core::array<irr::scene::CSceneManager::DefaultNodeEntry>::push_back
                    (in_stack_ffffffffffffff50,(DefaultNodeEntry *)in_stack_ffffffffffffff48);
        }
        local_18 = (u32)bVar6;
      }
      else if (in_EDX == 0x10) {
        uVar3 = (*in_RDI->_vptr_ISceneNode[0x23])(in_RDI,in_RSI);
        bVar6 = (uVar3 & 1) == 0;
        if (bVar6) {
          TransparentNodeEntry::TransparentNodeEntry
                    ((TransparentNodeEntry *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),in_RDI,
                     (vector3df *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          core::array<irr::scene::CSceneManager::TransparentNodeEntry>::push_back
                    ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)
                     in_stack_ffffffffffffff50,(TransparentNodeEntry *)in_stack_ffffffffffffff48);
        }
        local_18 = (u32)bVar6;
      }
      else if (in_EDX == 0x18) {
        uVar3 = (*in_RDI->_vptr_ISceneNode[0x23])(in_RDI,in_RSI);
        if ((uVar3 & 1) == 0) {
          uVar3 = (*in_RSI->_vptr_ISceneNode[0x16])();
          local_18 = 0;
          for (local_58 = 0; local_58 < uVar3; local_58 = local_58 + 1) {
            in_stack_ffffffffffffff50 =
                 *(array<irr::scene::CSceneManager::DefaultNodeEntry> **)&in_RDI->field_0xe8;
            iVar2 = (*in_RSI->_vptr_ISceneNode[0x15])(in_RSI,(ulong)local_58);
            uVar5 = (*(code *)(in_stack_ffffffffffffff50->m_data).
                              super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[0x33].TextureValue)
                              (in_stack_ffffffffffffff50,iVar2);
            if ((uVar5 & 1) != 0) {
              TransparentNodeEntry::TransparentNodeEntry
                        ((TransparentNodeEntry *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),in_RDI,
                         (vector3df *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
              ;
              core::array<irr::scene::CSceneManager::TransparentNodeEntry>::push_back
                        ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)
                         in_stack_ffffffffffffff50,(TransparentNodeEntry *)in_stack_ffffffffffffff48
                        );
              local_18 = 1;
              break;
            }
          }
          if (local_18 == 0) {
            n = (ISceneNode *)(in_RDI[1].AbsoluteTransformation.M + 6);
            DefaultNodeEntry::DefaultNodeEntry((DefaultNodeEntry *)in_stack_ffffffffffffff50,n);
            core::array<irr::scene::CSceneManager::DefaultNodeEntry>::push_back
                      (in_stack_ffffffffffffff50,(DefaultNodeEntry *)n);
            local_18 = 1;
          }
        }
      }
      else if (in_EDX == 0x20) {
        uVar3 = (*in_RDI->_vptr_ISceneNode[0x23])(in_RDI,in_RSI);
        bVar6 = (uVar3 & 1) == 0;
        if (bVar6) {
          TransparentNodeEntry::TransparentNodeEntry
                    ((TransparentNodeEntry *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),in_RDI,
                     (vector3df *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          core::array<irr::scene::CSceneManager::TransparentNodeEntry>::push_back
                    ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)
                     in_stack_ffffffffffffff50,(TransparentNodeEntry *)in_stack_ffffffffffffff48);
        }
        local_18 = (u32)bVar6;
      }
      else if ((in_EDX != 0x40) && (in_EDX == 0x80)) {
        uVar3 = (*in_RDI->_vptr_ISceneNode[0x23])(in_RDI,in_RSI);
        bVar6 = (uVar3 & 1) == 0;
        if (bVar6) {
          core::array<irr::scene::ISceneNode_*>::push_back
                    ((array<irr::scene::ISceneNode_*> *)in_stack_ffffffffffffff50,
                     (ISceneNode **)in_stack_ffffffffffffff48);
        }
        local_18 = (u32)bVar6;
      }
    }
  }
  return local_18;
}

Assistant:

u32 CSceneManager::registerNodeForRendering(ISceneNode *node, E_SCENE_NODE_RENDER_PASS pass)
{
	u32 taken = 0;

	switch (pass) {
		// take camera if it is not already registered
	case ESNRP_CAMERA: {
		taken = 1;
		for (u32 i = 0; i != CameraList.size(); ++i) {
			if (CameraList[i] == node) {
				taken = 0;
				break;
			}
		}
		if (taken) {
			CameraList.push_back(node);
		}
	} break;
	case ESNRP_SKY_BOX:
		SkyBoxList.push_back(node);
		taken = 1;
		break;
	case ESNRP_SOLID:
		if (!isCulled(node)) {
			SolidNodeList.push_back(node);
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT:
		if (!isCulled(node)) {
			TransparentNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT_EFFECT:
		if (!isCulled(node)) {
			TransparentEffectNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_AUTOMATIC:
		if (!isCulled(node)) {
			const u32 count = node->getMaterialCount();

			taken = 0;
			for (u32 i = 0; i < count; ++i) {
				if (Driver->needsTransparentRenderPass(node->getMaterial(i))) {
					// register as transparent node
					TransparentNodeEntry e(node, camWorldPos);
					TransparentNodeList.push_back(e);
					taken = 1;
					break;
				}
			}

			// not transparent, register as solid
			if (!taken) {
				SolidNodeList.push_back(node);
				taken = 1;
			}
		}
		break;
	case ESNRP_GUI:
		if (!isCulled(node)) {
			GuiNodeList.push_back(node);
			taken = 1;
		}

	// as of yet unused
	case ESNRP_LIGHT:
	case ESNRP_SHADOW:
	case ESNRP_NONE: // ignore this one
		break;
	}

	return taken;
}